

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void variance(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h,uint32_t *sse,int *sum)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)w;
  if (w < 1) {
    uVar3 = uVar4;
  }
  if (h < 1) {
    h = 0;
  }
  iVar1 = 0;
  uVar2 = 0;
  for (; (int)uVar4 != h; uVar4 = (ulong)((int)uVar4 + 1)) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = (uint)a[uVar5] - (uint)b[uVar5];
      iVar1 = iVar1 + iVar6;
      uVar2 = uVar2 + iVar6 * iVar6;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  *sum = iVar1;
  *sse = uVar2;
  return;
}

Assistant:

static void variance(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int w, int h, uint32_t *sse, int *sum) {
  int i, j;
  int tsum = 0;
  uint32_t tsse = 0;

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      tsum += diff;
      tsse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}